

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TerminalPrinter.cpp
# Opt level: O1

void pobr::utils::TerminalPrinter::printLabel(string *message,string *color)

{
  ostream *poVar1;
  stringstream temp;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"[",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,(message->_M_dataplus)._M_p,message->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  std::__cxx11::stringbuf::str();
  colorize(&local_1e0,&local_1c0,color);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void
TerminalPrinter::printLabel(const std::string& message, const std::string& color)
{
    std::stringstream temp;

    temp << "[" << message << "]";

    std::cout << TerminalPrinter::colorize(temp.str(), color)
              << " ";
}